

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetCompiledSourceNinjaPath_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  pointer pcVar1;
  string *psVar2;
  string local_40;
  
  psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + psVar2->_M_string_length);
  ConvertToNinjaAbsPath(__return_storage_ptr__,this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetCompiledSourceNinjaPath(
  cmSourceFile const* source) const
{
  // Pass source files to the compiler by absolute path.
  return this->ConvertToNinjaAbsPath(source->GetFullPath());
}